

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void FillAlignPrices(CLzmaEnc *p)

{
  UInt32 UVar1;
  long in_RDI;
  UInt32 i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x10; local_c = local_c + 1) {
    UVar1 = RcTree_ReverseGetPrice
                      ((UInt16 *)(in_RDI + 0x34298),4,local_c,(UInt32 *)(in_RDI + 0x32580));
    *(UInt32 *)(in_RDI + 0x33c14 + (ulong)local_c * 4) = UVar1;
  }
  *(undefined4 *)(in_RDI + 0xa4) = 0;
  return;
}

Assistant:

static void FillAlignPrices(CLzmaEnc *p)
{
  UInt32 i;
  for (i = 0; i < kAlignTableSize; i++)
    p->alignPrices[i] = RcTree_ReverseGetPrice(p->posAlignEncoder, kNumAlignBits, i, p->ProbPrices);
  p->alignPriceCount = 0;
}